

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O3

SP __thiscall pbrt::BinaryReader::createEntity(BinaryReader *this,int typeTag)

{
  ostream *poVar1;
  int in_EDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_21;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_22;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_23;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_24;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_25;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_26;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_27;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_29;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_31;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_32;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_33;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_34;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_35;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_36;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_37;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_39;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_41;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_42;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_43;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_44;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  SP SVar3;
  vec2i local_40;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined1 local_19;
  
  switch(in_EDX) {
  case 1:
    std::__shared_ptr<pbrt::Scene,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::Scene>>
              ((__shared_ptr<pbrt::Scene,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::Scene> *)&local_40);
    _Var2._M_pi = extraout_RDX;
    break;
  case 2:
    std::__shared_ptr<pbrt::Object,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::Object>>
              ((__shared_ptr<pbrt::Object,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::Object> *)&local_40);
    _Var2._M_pi = extraout_RDX_18;
    break;
  default:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"unknown entity type tag ",0x18);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,in_EDX);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," in binary file",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    local_38 = 0;
    uStack_34 = 0;
    uStack_30 = 0;
    uStack_2c = 0;
    _Var2._M_pi = extraout_RDX_27;
    break;
  case 4:
    std::__shared_ptr<pbrt::Instance,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::Instance>>
              ((__shared_ptr<pbrt::Instance,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::Instance> *)&local_40);
    _Var2._M_pi = extraout_RDX_29;
    break;
  case 5:
    std::__shared_ptr<pbrt::Camera,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::Camera>>
              ((__shared_ptr<pbrt::Camera,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::Camera> *)&local_40);
    _Var2._M_pi = extraout_RDX_17;
    break;
  case 6:
    local_40.x = 0;
    local_40.y = 0;
    std::__shared_ptr<pbrt::Film,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::Film>,pbrt::math::vec2i>
              ((__shared_ptr<pbrt::Film,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::Film> *)&local_19,&local_40);
    _Var2._M_pi = extraout_RDX_24;
    break;
  case 7:
    std::__shared_ptr<pbrt::Spectrum,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::Spectrum>>
              ((__shared_ptr<pbrt::Spectrum,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::Spectrum> *)&local_40);
    _Var2._M_pi = extraout_RDX_28;
    break;
  case 8:
    std::__shared_ptr<pbrt::Sampler,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::Sampler>>
              ((__shared_ptr<pbrt::Sampler,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::Sampler> *)&local_40);
    _Var2._M_pi = extraout_RDX_35;
    break;
  case 9:
    std::__shared_ptr<pbrt::Integrator,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::Integrator>>
              ((__shared_ptr<pbrt::Integrator,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::Integrator> *)&local_40);
    _Var2._M_pi = extraout_RDX_36;
    break;
  case 10:
    std::__shared_ptr<pbrt::Material,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::Material>>
              ((__shared_ptr<pbrt::Material,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::Material> *)&local_40);
    _Var2._M_pi = extraout_RDX_12;
    break;
  case 0xb:
    std::__shared_ptr<pbrt::DisneyMaterial,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::DisneyMaterial>>
              ((__shared_ptr<pbrt::DisneyMaterial,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::DisneyMaterial> *)&local_40);
    _Var2._M_pi = extraout_RDX_37;
    break;
  case 0xc:
    std::__shared_ptr<pbrt::UberMaterial,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::UberMaterial>>
              ((__shared_ptr<pbrt::UberMaterial,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::UberMaterial> *)&local_40);
    _Var2._M_pi = extraout_RDX_15;
    break;
  case 0xd:
    std::__shared_ptr<pbrt::MixMaterial,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::MixMaterial>>
              ((__shared_ptr<pbrt::MixMaterial,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::MixMaterial> *)&local_40);
    _Var2._M_pi = extraout_RDX_25;
    break;
  case 0xe:
    std::__shared_ptr<pbrt::GlassMaterial,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::GlassMaterial>>
              ((__shared_ptr<pbrt::GlassMaterial,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::GlassMaterial> *)&local_40);
    _Var2._M_pi = extraout_RDX_22;
    break;
  case 0xf:
    std::__shared_ptr<pbrt::MirrorMaterial,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::MirrorMaterial>>
              ((__shared_ptr<pbrt::MirrorMaterial,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::MirrorMaterial> *)&local_40);
    _Var2._M_pi = extraout_RDX_10;
    break;
  case 0x10:
    std::__shared_ptr<pbrt::MatteMaterial,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::MatteMaterial>>
              ((__shared_ptr<pbrt::MatteMaterial,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::MatteMaterial> *)&local_40);
    _Var2._M_pi = extraout_RDX_33;
    break;
  case 0x11:
    std::__shared_ptr<pbrt::SubstrateMaterial,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::SubstrateMaterial>>
              ((__shared_ptr<pbrt::SubstrateMaterial,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::SubstrateMaterial> *)&local_40);
    _Var2._M_pi = extraout_RDX_34;
    break;
  case 0x12:
    std::__shared_ptr<pbrt::SubSurfaceMaterial,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::SubSurfaceMaterial>>
              ((__shared_ptr<pbrt::SubSurfaceMaterial,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::SubSurfaceMaterial> *)&local_40);
    _Var2._M_pi = extraout_RDX_40;
    break;
  case 0x13:
    std::__shared_ptr<pbrt::FourierMaterial,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::FourierMaterial>>
              ((__shared_ptr<pbrt::FourierMaterial,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::FourierMaterial> *)&local_40);
    _Var2._M_pi = extraout_RDX_39;
    break;
  case 0x14:
    std::__shared_ptr<pbrt::MetalMaterial,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::MetalMaterial>>
              ((__shared_ptr<pbrt::MetalMaterial,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::MetalMaterial> *)&local_40);
    _Var2._M_pi = extraout_RDX_07;
    break;
  case 0x15:
    std::__shared_ptr<pbrt::PlasticMaterial,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::PlasticMaterial>>
              ((__shared_ptr<pbrt::PlasticMaterial,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::PlasticMaterial> *)&local_40);
    _Var2._M_pi = extraout_RDX_23;
    break;
  case 0x16:
    std::__shared_ptr<pbrt::TranslucentMaterial,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::TranslucentMaterial>>
              ((__shared_ptr<pbrt::TranslucentMaterial,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::TranslucentMaterial> *)&local_40);
    _Var2._M_pi = extraout_RDX_42;
    break;
  case 0x17:
    std::__shared_ptr<pbrt::HairMaterial,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::HairMaterial>>
              ((__shared_ptr<pbrt::HairMaterial,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::HairMaterial> *)&local_40);
    _Var2._M_pi = extraout_RDX_09;
    break;
  case 0x1e:
    std::__shared_ptr<pbrt::Texture,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::Texture>>
              ((__shared_ptr<pbrt::Texture,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::Texture> *)&local_40);
    _Var2._M_pi = extraout_RDX_21;
    break;
  case 0x1f:
    std::__shared_ptr<pbrt::ImageTexture,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::ImageTexture>>
              ((__shared_ptr<pbrt::ImageTexture,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::ImageTexture> *)&local_40);
    _Var2._M_pi = extraout_RDX_13;
    break;
  case 0x20:
    std::__shared_ptr<pbrt::ScaleTexture,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::ScaleTexture>>
              ((__shared_ptr<pbrt::ScaleTexture,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::ScaleTexture> *)&local_40);
    _Var2._M_pi = extraout_RDX_30;
    break;
  case 0x21:
    std::__shared_ptr<pbrt::PtexFileTexture,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::PtexFileTexture>>
              ((__shared_ptr<pbrt::PtexFileTexture,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::PtexFileTexture> *)&local_40);
    _Var2._M_pi = extraout_RDX_11;
    break;
  case 0x22:
    std::__shared_ptr<pbrt::ConstantTexture,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::ConstantTexture>>
              ((__shared_ptr<pbrt::ConstantTexture,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::ConstantTexture> *)&local_40);
    _Var2._M_pi = extraout_RDX_05;
    break;
  case 0x23:
    std::__shared_ptr<pbrt::CheckerTexture,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::CheckerTexture>>
              ((__shared_ptr<pbrt::CheckerTexture,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::CheckerTexture> *)&local_40);
    _Var2._M_pi = extraout_RDX_43;
    break;
  case 0x24:
    std::__shared_ptr<pbrt::WindyTexture,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::WindyTexture>>
              ((__shared_ptr<pbrt::WindyTexture,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::WindyTexture> *)&local_40);
    _Var2._M_pi = extraout_RDX_16;
    break;
  case 0x25:
    std::__shared_ptr<pbrt::FbmTexture,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::FbmTexture>>
              ((__shared_ptr<pbrt::FbmTexture,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::FbmTexture> *)&local_40);
    _Var2._M_pi = extraout_RDX_19;
    break;
  case 0x26:
    std::__shared_ptr<pbrt::MarbleTexture,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::MarbleTexture>>
              ((__shared_ptr<pbrt::MarbleTexture,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::MarbleTexture> *)&local_40);
    _Var2._M_pi = extraout_RDX_32;
    break;
  case 0x27:
    std::__shared_ptr<pbrt::MixTexture,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::MixTexture>>
              ((__shared_ptr<pbrt::MixTexture,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::MixTexture> *)&local_40);
    _Var2._M_pi = extraout_RDX_20;
    break;
  case 0x28:
    std::__shared_ptr<pbrt::WrinkledTexture,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::WrinkledTexture>>
              ((__shared_ptr<pbrt::WrinkledTexture,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::WrinkledTexture> *)&local_40);
    _Var2._M_pi = extraout_RDX_01;
    break;
  case 0x32:
    std::__shared_ptr<pbrt::TriangleMesh,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::TriangleMesh>>
              ((__shared_ptr<pbrt::TriangleMesh,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::TriangleMesh> *)&local_40);
    _Var2._M_pi = extraout_RDX_08;
    break;
  case 0x33:
    std::__shared_ptr<pbrt::QuadMesh,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::QuadMesh>>
              ((__shared_ptr<pbrt::QuadMesh,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::QuadMesh> *)&local_40);
    _Var2._M_pi = extraout_RDX_38;
    break;
  case 0x34:
    std::__shared_ptr<pbrt::Sphere,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::Sphere>>
              ((__shared_ptr<pbrt::Sphere,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::Sphere> *)&local_40);
    _Var2._M_pi = extraout_RDX_44;
    break;
  case 0x35:
    std::__shared_ptr<pbrt::Disk,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::Disk>>
              ((__shared_ptr<pbrt::Disk,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::Disk> *)&local_40);
    _Var2._M_pi = extraout_RDX_04;
    break;
  case 0x36:
    std::__shared_ptr<pbrt::Curve,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::Curve>>
              ((__shared_ptr<pbrt::Curve,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::Curve> *)&local_40);
    _Var2._M_pi = extraout_RDX_31;
    break;
  case 0x3c:
    std::__shared_ptr<pbrt::DiffuseAreaLightBB,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::DiffuseAreaLightBB>>
              ((__shared_ptr<pbrt::DiffuseAreaLightBB,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::DiffuseAreaLightBB> *)&local_40);
    _Var2._M_pi = extraout_RDX_03;
    break;
  case 0x3d:
    std::__shared_ptr<pbrt::DiffuseAreaLightRGB,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::DiffuseAreaLightRGB>>
              ((__shared_ptr<pbrt::DiffuseAreaLightRGB,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::DiffuseAreaLightRGB> *)&local_40);
    _Var2._M_pi = extraout_RDX_02;
    break;
  case 0x46:
    std::__shared_ptr<pbrt::InfiniteLightSource,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::InfiniteLightSource>>
              ((__shared_ptr<pbrt::InfiniteLightSource,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::InfiniteLightSource> *)&local_40);
    _Var2._M_pi = extraout_RDX_14;
    break;
  case 0x47:
    std::__shared_ptr<pbrt::DistantLightSource,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::DistantLightSource>>
              ((__shared_ptr<pbrt::DistantLightSource,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::DistantLightSource> *)&local_40);
    _Var2._M_pi = extraout_RDX_26;
    break;
  case 0x48:
    std::__shared_ptr<pbrt::SpotLightSource,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::SpotLightSource>>
              ((__shared_ptr<pbrt::SpotLightSource,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::SpotLightSource> *)&local_40);
    _Var2._M_pi = extraout_RDX_41;
    break;
  case 0x49:
    std::__shared_ptr<pbrt::PointLightSource,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::PointLightSource>>
              ((__shared_ptr<pbrt::PointLightSource,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::PointLightSource> *)&local_40);
    _Var2._M_pi = extraout_RDX_00;
    break;
  case 0x50:
    std::__shared_ptr<pbrt::PixelFilter,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::PixelFilter>>
              ((__shared_ptr<pbrt::PixelFilter,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<pbrt::PixelFilter> *)&local_40);
    _Var2._M_pi = extraout_RDX_06;
  }
  *(undefined4 *)
   &(this->currentEntityData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = local_38;
  *(undefined4 *)
   ((long)&(this->currentEntityData).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = uStack_34;
  *(undefined4 *)
   &(this->currentEntityData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = uStack_30;
  *(undefined4 *)
   ((long)&(this->currentEntityData).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = uStack_2c;
  SVar3.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi
  ;
  SVar3.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SP)SVar3.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Entity::SP createEntity(int typeTag)
    {
      switch (typeTag) {
      case TYPE_SCENE:
        return std::make_shared<Scene>();
      case TYPE_TEXTURE:
        return std::make_shared<Texture>();
      case TYPE_IMAGE_TEXTURE:
        return std::make_shared<ImageTexture>();
      case TYPE_SCALE_TEXTURE:
        return std::make_shared<ScaleTexture>();
      case TYPE_PTEX_FILE_TEXTURE:
        return std::make_shared<PtexFileTexture>();
      case TYPE_CONSTANT_TEXTURE:
        return std::make_shared<ConstantTexture>();
      case TYPE_CHECKER_TEXTURE:
        return std::make_shared<CheckerTexture>();
      case TYPE_WINDY_TEXTURE:
        return std::make_shared<WindyTexture>();
      case TYPE_FBM_TEXTURE:
        return std::make_shared<FbmTexture>();
      case TYPE_MARBLE_TEXTURE:
        return std::make_shared<MarbleTexture>();
      case TYPE_MIX_TEXTURE:
        return std::make_shared<MixTexture>();
      case TYPE_WRINKLED_TEXTURE:
        return std::make_shared<WrinkledTexture>();
      case TYPE_MATERIAL:
        return std::make_shared<Material>();
      case TYPE_DISNEY_MATERIAL:
        return std::make_shared<DisneyMaterial>();
      case TYPE_UBER_MATERIAL:
        return std::make_shared<UberMaterial>();
      case TYPE_MIX_MATERIAL:
        return std::make_shared<MixMaterial>();
      case TYPE_TRANSLUCENT_MATERIAL:
        return std::make_shared<TranslucentMaterial>();
      case TYPE_GLASS_MATERIAL:
        return std::make_shared<GlassMaterial>();
      case TYPE_PLASTIC_MATERIAL:
        return std::make_shared<PlasticMaterial>();
      case TYPE_MIRROR_MATERIAL:
        return std::make_shared<MirrorMaterial>();
      case TYPE_SUBSTRATE_MATERIAL:
        return std::make_shared<SubstrateMaterial>();
      case TYPE_SUBSURFACE_MATERIAL:
        return std::make_shared<SubSurfaceMaterial>();
      case TYPE_MATTE_MATERIAL:
        return std::make_shared<MatteMaterial>();
      case TYPE_FOURIER_MATERIAL:
        return std::make_shared<FourierMaterial>();
      case TYPE_METAL_MATERIAL:
        return std::make_shared<MetalMaterial>();
      case TYPE_HAIR_MATERIAL:
        return std::make_shared<HairMaterial>();
      case TYPE_FILM:
        return std::make_shared<Film>(vec2i(0));
      case TYPE_CAMERA:
        return std::make_shared<Camera>();
      case TYPE_TRIANGLE_MESH:
        return std::make_shared<TriangleMesh>();
      case TYPE_QUAD_MESH:
        return std::make_shared<QuadMesh>();
      case TYPE_SPHERE:
        return std::make_shared<Sphere>();
      case TYPE_DISK:
        return std::make_shared<Disk>();
      case TYPE_CURVE:
        return std::make_shared<Curve>();
      case TYPE_INSTANCE:
        return std::make_shared<Instance>();
      case TYPE_OBJECT:
        return std::make_shared<Object>();
      case TYPE_DIFFUSE_AREALIGHT_BB:
        return std::make_shared<DiffuseAreaLightBB>();
      case TYPE_DIFFUSE_AREALIGHT_RGB:
        return std::make_shared<DiffuseAreaLightRGB>();
      case TYPE_INFINITE_LIGHT_SOURCE:
        return std::make_shared<InfiniteLightSource>();
      case TYPE_DISTANT_LIGHT_SOURCE:
        return std::make_shared<DistantLightSource>();
      case TYPE_SPOT_LIGHT_SOURCE:
        return std::make_shared<SpotLightSource>();
      case TYPE_POINT_LIGHT_SOURCE:
        return std::make_shared<PointLightSource>();
      case TYPE_SPECTRUM:
        return std::make_shared<Spectrum>();
      case TYPE_SAMPLER:
        return std::make_shared<Sampler>();
      case TYPE_INTEGRATOR:
        return std::make_shared<Integrator>();
      case TYPE_PIXEL_FILTER:
        return std::make_shared<PixelFilter>();
      default:
        std::cerr << "unknown entity type tag " << typeTag << " in binary file" << std::endl;
        return Entity::SP();
      };
    }